

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall
restincurl::CurlException::CurlException(CurlException *this,string *msg,CURLMcode err)

{
  __cxx11 local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [36];
  CURLMcode local_1c;
  string *psStack_18;
  CURLMcode err_local;
  string *msg_local;
  CurlException *this_local;
  
  local_1c = err;
  psStack_18 = msg;
  msg_local = (string *)this;
  std::operator+(local_a0,(char)msg);
  std::__cxx11::to_string(local_c0,local_1c);
  std::operator+(local_80,local_a0);
  std::operator+(local_60,(char *)local_80);
  curl_multi_strerror(local_1c);
  std::operator+(local_40,(char *)local_60);
  Exception::Exception(&this->super_Exception,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_a0);
  *(undefined ***)&this->super_Exception = &PTR__CurlException_001b4a20;
  this->err_ = local_1c;
  return;
}

Assistant:

CurlException(const std::string msg, const CURLMcode err)
            : Exception(msg + '(' + std::to_string(err) + "): " + curl_multi_strerror(err))
            , err_{err}
            {}